

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O0

void __thiscall katherine::system_error::system_error(system_error *this,int rc)

{
  char *__s;
  allocator<char> local_39;
  string local_38;
  int local_14;
  system_error *psStack_10;
  int rc_local;
  system_error *this_local;
  
  local_14 = rc;
  psStack_10 = this;
  __s = strerror(rc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  error::error(&this->super_error,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  *(undefined ***)&this->super_error = &PTR__system_error_00107d48;
  return;
}

Assistant:

system_error(int rc) :error{std::strerror(rc)} { }